

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void print_instruction(instruction *inst,int format_blank_count)

{
  float fVar1;
  float *pfVar2;
  uint uVar3;
  float local_5c;
  int i;
  memArgs *memArgs1;
  call_indirectArgs *callIndirectArgs1;
  callArgs *callArgs1;
  brTableArgs *brTableArgs1;
  brArgs *brArgs1;
  ifArgs *ifArgs1;
  blockArgs *blockArgs1;
  void *arg;
  int format_blank_count_local;
  instruction *inst_local;
  
  printf("%s ",opNames[inst->op_code]);
  pfVar2 = (float *)inst->arg;
  if (pfVar2 == (float *)0x0) {
    printf("\n");
  }
  else {
    uVar3 = (uint)inst->op_code;
    if (uVar3 - 2 < 2) {
      fVar1 = *pfVar2;
      if (fVar1 == -NAN) {
        printf("\n");
      }
      else if (fVar1 == -NAN) {
        printf("f64\n");
      }
      else if (fVar1 == -NAN) {
        printf("f32\n");
      }
      else if (fVar1 == -NAN) {
        printf("i64\n");
      }
      else if (fVar1 == -NAN) {
        printf("i32\n");
      }
      print_instructions((vec *)(pfVar2 + 2),format_blank_count + 2,true);
    }
    else if (uVar3 == 4) {
      fVar1 = *pfVar2;
      if (fVar1 == -NAN) {
        printf("\n");
      }
      else if (fVar1 == -NAN) {
        printf("f64\n");
      }
      else if (fVar1 == -NAN) {
        printf("f32\n");
      }
      else if (fVar1 == -NAN) {
        printf("i64\n");
      }
      else if (fVar1 == -NAN) {
        printf("i32\n");
      }
      print_instructions((vec *)(pfVar2 + 2),format_blank_count + 2,true);
      print_instructions((vec *)(pfVar2 + 0x16),format_blank_count + 2,true);
    }
    else if (uVar3 - 0xc < 2) {
      printf("%u\n",(ulong)(uint)*pfVar2);
    }
    else if (uVar3 == 0xe) {
      for (local_5c = 0.0; (uint)local_5c < (uint)pfVar2[1]; local_5c = (float)((int)local_5c + 1))
      {
        printf("%u ",(ulong)*(uint *)(*(long *)(pfVar2 + 2) + (long)(int)local_5c * 4));
      }
      printf("%u(default)",(ulong)(uint)*pfVar2);
      printf("\n");
    }
    else if (uVar3 == 0x10) {
      printf("%u\n",(ulong)(uint)*pfVar2);
    }
    else if (uVar3 == 0x11) {
      printf("index:%u table:0x0\n",(ulong)(uint)*pfVar2);
    }
    else if (uVar3 - 0x20 < 5) {
      printf("%u\n",(ulong)(uint)*pfVar2);
    }
    else if (uVar3 - 0x3f < 2) {
      printf("0x0\n");
    }
    else if (uVar3 == 0x41) {
      printf("%d\n",(ulong)(uint)*pfVar2);
    }
    else if (uVar3 == 0x42) {
      printf("%ld\n",*(undefined8 *)pfVar2);
    }
    else if (uVar3 == 0x43) {
      printf("%.2f\n",(double)*pfVar2);
    }
    else if (uVar3 == 0x44) {
      printf("%.2f\n",*(undefined8 *)pfVar2);
    }
    else if (uVar3 == 0xfc) {
      printf("%d\n",(ulong)*(byte *)pfVar2);
    }
    else if ((0x27 < inst->op_code) && (inst->op_code < 0x3f)) {
      printf("align=%u offset=%lu\n",(ulong)(uint)*pfVar2,*(undefined8 *)(pfVar2 + 2));
    }
  }
  return;
}

Assistant:

void print_instruction(instruction *inst, int format_blank_count) {
    printf("%s ", getOpName(inst));
    void *arg = inst->arg;
    blockArgs *blockArgs1;
    ifArgs *ifArgs1;
    brArgs *brArgs1;
    brTableArgs *brTableArgs1;
    callArgs *callArgs1;
    call_indirectArgs *callIndirectArgs1;
    memArgs *memArgs1;
    if (NULL != arg) {
        switch (inst->op_code) {
            case Block:
            case Loop:
                blockArgs1 = (blockArgs *) arg;
                switch (((blockArgs *) arg)->blockType) {
                    case -1:
                        printf("i32\n");
                        break;
                    case -2:
                        printf("i64\n");
                        break;
                    case -3:
                        printf("f32\n");
                        break;
                    case -4:
                        printf("f64\n");
                        break;
                    case -64:
                        printf("\n");
                        break;
                    default:
                        break;
                }
                print_instructions(&blockArgs1->instructions, format_blank_count + 2, true);
                break;
            case If:
                ifArgs1 = (ifArgs *) arg;
                switch (((blockArgs *) arg)->blockType) {
                    case -1:
                        printf("i32\n");
                        break;
                    case -2:
                        printf("i64\n");
                        break;
                    case -3:
                        printf("f32\n");
                        break;
                    case -4:
                        printf("f64\n");
                        break;
                    case -64:
                        printf("\n");
                        break;
                    default:
                        break;
                }
                print_instructions(&ifArgs1->instructions1, format_blank_count + 2, true);
                print_instructions(&ifArgs1->instructions2, format_blank_count + 2, true);
                break;
            case Br:
            case BrIf:
                brArgs1 = (brArgs *) arg;
                printf("%u\n", *brArgs1);
                break;
            case BrTable:
                brTableArgs1 = (brTableArgs *) arg;
                for (int i = 0; i < brTableArgs1->labelCount; ++i) {
                    printf("%u ", *(brTableArgs1->labels + i));
                }
                printf("%u(default)", brTableArgs1->defaultLabels);
                printf("\n");
                break;
            case Call:
                callArgs1 = (callArgs *) arg;
                printf("%u\n", *callArgs1);
                break;
            case CallIndirect:
                callIndirectArgs1 = (call_indirectArgs *) arg;
                printf("index:%u table:0x0\n", callIndirectArgs1->t_index);
                break;
            case LocalGet:
            case LocalSet:
            case LocalTee:
            case GlobalGet:
            case GlobalSet:
                printf("%u\n", *(uint32 *) arg);
                break;
            case MemorySize:
            case MemoryGrow:
                printf("0x0\n");
                break;
            case I32Const:
                printf("%d\n", *(int32 *) arg);
                break;
            case I64Const:
                printf("%ld\n", *(int64 *) arg);
                break;
            case F32Const:
                printf("%.2f\n", *(float32 *) arg);
                break;
            case F64Const:
                printf("%.2f\n", *(float64 *) arg);
                break;
            case TruncSat:
                printf("%d\n", *(truncSatArgs *) arg);
                break;
            default:
                if (I32Load <= inst->op_code && inst->op_code <= I64Store32) {
                    memArgs1 = (memArgs *) arg;
                    printf("align=%u offset=%lu\n", memArgs1->align, memArgs1->offset);
                    break;
                }
        }
    } else {
        printf("\n");
    }
}